

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_info.cc
# Opt level: O0

void lf::mesh::utils::PrintInfo(ostream *o,Mesh *mesh,int ctrl)

{
  Entity *pEVar1;
  bool bVar2;
  RefElType RVar3;
  RefElType RVar4;
  uint from;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  reference ppEVar9;
  undefined4 extraout_var_00;
  runtime_error *prVar10;
  MatrixXd *pMVar11;
  undefined4 extraout_var_01;
  Matrix<double,__1,__1,_0,__1,__1> local_8c8;
  Entity *local_8b0;
  Entity *sub_ent;
  iterator __end7;
  iterator __begin7;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range7;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sub_ent_range;
  int l;
  MatrixXd *ref_el_corners;
  allocator<char> local_849;
  string local_848;
  allocator<char> local_821;
  string local_820;
  stringstream local_800 [8];
  stringstream ss_3;
  undefined1 local_7f0 [376];
  string local_678;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  stringstream local_608 [8];
  stringstream ss_2;
  undefined1 local_5f8 [383];
  RefEl local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  stringstream local_408 [8];
  stringstream ss_1;
  undefined1 local_3f8 [376];
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  stringstream local_200 [8];
  stringstream ss;
  undefined1 local_1f0 [383];
  RefEl local_71;
  long *plStack_70;
  RefEl e_refel;
  Geometry *e_geo_ptr;
  dim_t e_codim;
  size_type e_idx;
  Entity *e;
  iterator __end4;
  iterator __begin4;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range4;
  uint local_28;
  size_type no_ent;
  int co_dim;
  dim_t dim_world;
  dim_t dim_mesh;
  int ctrl_local;
  Mesh *mesh_local;
  ostream *o_local;
  
  from = (**mesh->_vptr_Mesh)();
  iVar5 = (*mesh->_vptr_Mesh[1])();
  poVar8 = std::operator<<(o,"Mesh of dimension ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,from);
  poVar8 = std::operator<<(poVar8,", ambient dimension ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
  std::operator<<(poVar8,'\n');
  if (10 < ctrl) {
    for (local_28 = lf::base::narrow<int,unsigned_int>(from); -1 < (int)local_28;
        local_28 = local_28 - 1) {
      uVar6 = (*mesh->_vptr_Mesh[3])(mesh,(ulong)local_28);
      poVar8 = std::operator<<(o,"Co-dimension ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_28);
      poVar8 = std::operator<<(poVar8,": ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
      poVar8 = std::operator<<(poVar8," entities");
      std::operator<<(poVar8,'\n');
      iVar5 = (*mesh->_vptr_Mesh[2])(mesh,(ulong)local_28);
      __begin4._M_current = (Entity **)CONCAT44(extraout_var,iVar5);
      __end4 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin4);
      e = (Entity *)
          std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin4);
      while (bVar2 = __gnu_cxx::
                     operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               (&__end4,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                         *)&e), ((bVar2 ^ 0xffU) & 1) != 0) {
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end4);
        pEVar1 = *ppEVar9;
        uVar6 = (*mesh->_vptr_Mesh[5])(mesh,pEVar1);
        uVar7 = (**pEVar1->_vptr_Entity)();
        iVar5 = (*pEVar1->_vptr_Entity[3])();
        plStack_70 = (long *)CONCAT44(extraout_var_00,iVar5);
        iVar5 = (*pEVar1->_vptr_Entity[4])();
        local_71.type_ = (RefElType)iVar5;
        if (plStack_70 == (long *)0x0) {
          std::__cxx11::stringstream::stringstream(local_200);
          poVar8 = (ostream *)std::ostream::operator<<(local_1f0,local_28);
          poVar8 = std::operator<<(poVar8,"-entity ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
          std::operator<<(poVar8,": missing geometry");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,"e_geo_ptr",&local_231);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
                     ,&local_259);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_230,&local_258,0x2a,&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator(&local_259);
          std::__cxx11::string::~string((string *)&local_230);
          std::allocator<char>::~allocator(&local_231);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"this code should not be reached");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar5 = (**(code **)*plStack_70)();
        if (iVar5 != from - local_28) {
          std::__cxx11::stringstream::stringstream(local_408);
          poVar8 = (ostream *)std::ostream::operator<<(local_3f8,local_28);
          poVar8 = std::operator<<(poVar8,"-entity ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
          std::operator<<(poVar8,": wrong dimension");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"e_geo_ptr->DimLocal() == dim_mesh - co_dim",&local_429);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
                     ,&local_451);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_428,&local_450,0x2c,&local_478);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_450);
          std::allocator<char>::~allocator(&local_451);
          std::__cxx11::string::~string((string *)&local_428);
          std::allocator<char>::~allocator(&local_429);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"this code should not be reached");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_479.type_ = (**(code **)(*plStack_70 + 0x10))();
        RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_479);
        RVar4 = lf::base::RefEl::operator_cast_to_RefElType(&local_71);
        if (RVar3 != RVar4) {
          std::__cxx11::stringstream::stringstream(local_608);
          poVar8 = (ostream *)std::ostream::operator<<(local_5f8,local_28);
          poVar8 = std::operator<<(poVar8,"-entity ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
          std::operator<<(poVar8,": refEl mismatch");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_628,"e_geo_ptr->RefEl() == e_refel",&local_629);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_650,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
                     ,&local_651);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_628,&local_650,0x2e,&local_678);
          std::__cxx11::string::~string((string *)&local_678);
          std::__cxx11::string::~string((string *)&local_650);
          std::allocator<char>::~allocator(&local_651);
          std::__cxx11::string::~string((string *)&local_628);
          std::allocator<char>::~allocator(&local_629);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"this code should not be reached");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (uVar7 != local_28) {
          std::__cxx11::stringstream::stringstream(local_800);
          poVar8 = (ostream *)std::ostream::operator<<(local_7f0,local_28);
          poVar8 = std::operator<<(poVar8,"-entity ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
          std::operator<<(poVar8," co-dimension mismatch");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_820,"e_codim == co_dim",&local_821);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_848,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
                     ,&local_849);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_820,&local_848,0x30,(string *)&ref_el_corners);
          std::__cxx11::string::~string((string *)&ref_el_corners);
          std::__cxx11::string::~string((string *)&local_848);
          std::allocator<char>::~allocator(&local_849);
          std::__cxx11::string::~string((string *)&local_820);
          std::allocator<char>::~allocator(&local_821);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"this code should not be reached");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pMVar11 = lf::base::RefEl::NodeCoords(&local_71);
        poVar8 = std::operator<<(o,"entity ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
        poVar8 = std::operator<<(poVar8," (");
        poVar8 = lf::base::operator<<(poVar8,&local_71);
        std::operator<<(poVar8,"): ");
        if (0x5a < ctrl) {
          for (sub_ent_range._M_extent._M_extent_value._4_4_ = 1;
              uVar6 = sub_ent_range._M_extent._M_extent_value._4_4_,
              iVar5 = lf::base::narrow<int,unsigned_int>(from),
              (int)uVar6 <= (int)(iVar5 - local_28);
              sub_ent_range._M_extent._M_extent_value._4_4_ =
                   sub_ent_range._M_extent._M_extent_value._4_4_ + 1) {
            poVar8 = std::operator<<(o,"rel codim-");
            poVar8 = (ostream *)
                     std::ostream::operator<<(poVar8,sub_ent_range._M_extent._M_extent_value._4_4_);
            std::operator<<(poVar8," subent: [");
            iVar5 = (*pEVar1->_vptr_Entity[1])
                              (pEVar1,(ulong)sub_ent_range._M_extent._M_extent_value._4_4_);
            __range7 = (span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                       CONCAT44(extraout_var_01,iVar5);
            __end7 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                               ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                &__range7);
            sub_ent = (Entity *)
                      std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                                ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                 &__range7);
            while (bVar2 = __gnu_cxx::
                           operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                     (&__end7,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                               *)&sub_ent), ((bVar2 ^ 0xffU) & 1) != 0) {
              ppEVar9 = __gnu_cxx::
                        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        ::operator*(&__end7);
              local_8b0 = *ppEVar9;
              uVar6 = (*mesh->_vptr_Mesh[5])(mesh,local_8b0);
              poVar8 = (ostream *)std::ostream::operator<<(o,uVar6);
              std::operator<<(poVar8,' ');
              __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator++(&__end7);
            }
            std::operator<<(o,"]");
          }
        }
        if (0x32 < ctrl) {
          poVar8 = std::operator<<(o,'\n');
          (**(code **)(*plStack_70 + 0x18))
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_8c8,plStack_70,
                     pMVar11);
          Eigen::operator<<(poVar8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                   &local_8c8);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_8c8);
        }
        std::operator<<(o,'\n');
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end4);
      }
    }
  }
  return;
}

Assistant:

void PrintInfo(std::ostream &o, const lf::mesh::Mesh &mesh, int ctrl) {
  using dim_t = lf::base::dim_t;
  using size_type = lf::base::size_type;

  const dim_t dim_mesh = mesh.DimMesh();
  const dim_t dim_world = mesh.DimWorld();
  o << "Mesh of dimension " << static_cast<int>(dim_mesh)
    << ", ambient dimension " << static_cast<int>(dim_world) << '\n';

  if (ctrl > 10) {
    // Loop over codimensions

    for (int co_dim = base::narrow<int>(dim_mesh); co_dim >= 0; co_dim--) {
      const size_type no_ent = mesh.NumEntities(co_dim);
      o << "Co-dimension " << co_dim << ": " << no_ent << " entities" << '\n';

      // Loop over entities
      for (const Entity *e : mesh.Entities(co_dim)) {
        const size_type e_idx = mesh.Index(*e);
        const dim_t e_codim = e->Codim();
        const geometry::Geometry *e_geo_ptr = e->Geometry();
        const lf::base::RefEl e_refel = e->RefEl();

        LF_VERIFY_MSG(e_geo_ptr,
                      co_dim << "-entity " << e_idx << ": missing geometry");
        LF_VERIFY_MSG(e_geo_ptr->DimLocal() == dim_mesh - co_dim,
                      co_dim << "-entity " << e_idx << ": wrong dimension");
        LF_VERIFY_MSG(e_geo_ptr->RefEl() == e_refel,
                      co_dim << "-entity " << e_idx << ": refEl mismatch");
        LF_VERIFY_MSG(e_codim == co_dim, co_dim << "-entity " << e_idx
                                                << " co-dimension mismatch");
        const Eigen::MatrixXd &ref_el_corners(e_refel.NodeCoords());
        o << "entity " << e_idx << " (" << e_refel << "): ";

        // Loop over local co-dimensions
        if (ctrl > 90) {
          for (int l = 1; l <= base::narrow<int>(dim_mesh) - co_dim; l++) {
            o << "rel codim-" << l << " subent: [";
            // Fetch subentities of co-dimension l
            auto sub_ent_range = e->SubEntities(l);
            for (const Entity *sub_ent : sub_ent_range) {
              o << mesh.Index(*sub_ent) << ' ';
            }
            o << "]";
          }
        }
        if (ctrl > 50) {
          o << '\n' << e_geo_ptr->Global(ref_el_corners);
        }
        o << '\n';
      }  // end loop over entities
    }  // end loop over co-dimensions
  }  // end printinfo_ctrl > 10
}